

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O1

void __thiscall EnvmapImage::clear(EnvmapImage *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Rgba *__s;
  ulong uVar6;
  
  iVar1 = (this->_dataWindow).max.y;
  iVar2 = (this->_dataWindow).min.y;
  if (iVar2 <= iVar1) {
    iVar3 = (this->_dataWindow).min.x;
    iVar4 = (this->_dataWindow).max.x;
    __s = (this->_pixels)._data;
    lVar5 = (this->_pixels)._sizeY;
    uVar6 = (ulong)((iVar1 - iVar2) + 1);
    do {
      if (iVar3 <= iVar4) {
        memset(__s,0,(ulong)((iVar4 - iVar3) + 1) << 3);
      }
      __s = __s + lVar5;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void
EnvmapImage::clear ()
{
    int w = _dataWindow.max.x - _dataWindow.min.x + 1;
    int h = _dataWindow.max.y - _dataWindow.min.y + 1;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = _pixels[y][x];

            p.r = 0;
            p.g = 0;
            p.b = 0;
            p.a = 0;
        }
    }
}